

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O3

int Kit_SopAnyLiteral(Kit_Sop_t *cSop,int nLits)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (0 < nLits) {
    uVar1 = 0;
    do {
      if (0 < cSop->nCubes) {
        uVar3 = 0;
        uVar2 = 0;
        do {
          if (cSop->pCubes[uVar3] == 0) break;
          uVar2 = uVar2 + ((cSop->pCubes[uVar3] >> (uVar1 & 0x1f) & 1) != 0);
          uVar3 = uVar3 + 1;
        } while ((uint)cSop->nCubes != uVar3);
        if (1 < uVar2) {
          return uVar1;
        }
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != nLits);
  }
  return -1;
}

Assistant:

int Kit_SopAnyLiteral( Kit_Sop_t * cSop, int nLits )
{
    unsigned uCube;
    int i, k, nLitsCur;
    // go through each literal
    for ( i = 0; i < nLits; i++ )
    {
        // go through all the cubes
        nLitsCur = 0;
        Kit_SopForEachCube( cSop, uCube, k )
            if ( Kit_CubeHasLit(uCube, i) )
                nLitsCur++;
        if ( nLitsCur > 1 )
            return i;
    }
    return -1;
}